

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localpointer.h
# Opt level: O2

void __thiscall
icu_63::LocalPointer<icu_63::number::impl::DecimalFormatProperties>::adoptInsteadAndCheckErrorCode
          (LocalPointer<icu_63::number::impl::DecimalFormatProperties> *this,
          DecimalFormatProperties *p,UErrorCode *errorCode)

{
  DecimalFormatProperties *pDVar1;
  DecimalFormatProperties *p_00;
  
  if (U_ZERO_ERROR < *errorCode) {
    pDVar1 = p;
    if (p != (DecimalFormatProperties *)0x0) {
      icu_63::number::impl::DecimalFormatProperties::~DecimalFormatProperties(p);
    }
    UMemory::operator_delete((UMemory *)p,pDVar1);
    return;
  }
  pDVar1 = (this->super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>).ptr;
  p_00 = p;
  if (pDVar1 != (DecimalFormatProperties *)0x0) {
    icu_63::number::impl::DecimalFormatProperties::~DecimalFormatProperties(pDVar1);
  }
  UMemory::operator_delete((UMemory *)pDVar1,p_00);
  (this->super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>).ptr = p;
  if (p == (DecimalFormatProperties *)0x0) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

void adoptInsteadAndCheckErrorCode(T *p, UErrorCode &errorCode) {
        if(U_SUCCESS(errorCode)) {
            delete LocalPointerBase<T>::ptr;
            LocalPointerBase<T>::ptr=p;
            if(p==NULL) {
                errorCode=U_MEMORY_ALLOCATION_ERROR;
            }
        } else {
            delete p;
        }
    }